

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O2

Vec4 __thiscall tcu::linearToSRGBIfNeeded(tcu *this,TextureFormat *format,Vec4 *color)

{
  undefined8 extraout_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  Vec4 VVar1;
  Vec4 VVar2;
  undefined1 auVar3 [12];
  undefined8 uVar4;
  
  if (format->order - sR < 6) {
    VVar1 = linearToSRGB(this,color);
  }
  else {
    Vector<float,_4>::Vector((Vector<float,_4> *)this,color);
    VVar1.m_data[2] = (float)(int)in_XMM1_Qa;
    VVar1.m_data[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
    VVar1.m_data[0] = (float)(int)extraout_XMM0_Qa;
    VVar1.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  }
  VVar2.m_data[0] = VVar1.m_data[0];
  auVar3._4_4_ = VVar1.m_data[1];
  register0x00001240 = VVar1.m_data[2];
  register0x00001244 = VVar1.m_data[3];
  return (Vec4)VVar2.m_data;
}

Assistant:

tcu::Vec4 linearToSRGBIfNeeded (const TextureFormat& format, const tcu::Vec4& color)
{
	return isSRGB(format) ? linearToSRGB(color) : color;
}